

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Counter.cpp
# Opt level: O2

string * __thiscall aeron::Counter::label_abi_cxx11_(string *__return_storage_ptr__,Counter *this)

{
  concurrent::CountersReader::getCounterLabel_abi_cxx11_
            (__return_storage_ptr__,&this->m_clientConductor->m_countersReader,
             (this->super_AtomicCounter).m_counterId);
  return __return_storage_ptr__;
}

Assistant:

std::string Counter::label() const
{
    return m_clientConductor->countersReader().getCounterLabel(id());
}